

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O2

void __thiscall
DSBarInfo::DrawGraphic
          (DSBarInfo *this,FTexture *texture,SBarInfoCoordinate x,SBarInfoCoordinate y,int xOffset,
          int yOffset,double Alpha,bool fullScreenOffsets,bool translate,bool dim,int offsetflags)

{
  undefined4 uVar1;
  undefined4 uVar3;
  double dVar2;
  bool bVar4;
  SBarInfo *pSVar5;
  ulong uVar6;
  _func_int **pp_Var7;
  ulong uVar8;
  FRemapTable *pFVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  DFrameBuffer *this_00;
  ulong uVar13;
  undefined8 uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double h;
  int in_stack_00000030;
  int in_stack_00000038;
  double *in_stack_00000040;
  double w;
  double dy;
  double dx;
  double yScale;
  double ry;
  double local_88;
  double local_80;
  double local_78;
  double rx;
  double tmp;
  double local_60;
  double local_58;
  double dcb;
  double dcy;
  double local_40;
  double dcr;
  
  if (texture == (FTexture *)0x0) {
    return;
  }
  local_40 = (double)((int)x >> 1);
  local_60 = (double)((int)y >> 1);
  uVar11 = ~offsetflags;
  if ((uVar11 & 0x42) == 0) {
    if (in_stack_00000030 < 0) {
      dVar17 = (texture->Scale).X;
      local_40 = local_40 +
                 (double)(int)texture->LeftOffset / dVar17 +
                 ((double)texture->Width / dVar17) * -0.5;
    }
    else {
      dVar17 = (texture->Scale).X;
      local_40 = local_40 -
                 (0.5 - ((double)(int)texture->LeftOffset / dVar17) /
                        ((double)texture->Width / dVar17)) * (double)in_stack_00000030;
    }
    if (in_stack_00000038 < 0) {
      dVar17 = (texture->Scale).Y;
      local_60 = local_60 +
                 (double)(int)texture->TopOffset / dVar17 +
                 ((double)texture->Height / dVar17) * -0.5;
    }
    else {
      dVar17 = (texture->Scale).Y;
      local_60 = local_60 -
                 (0.5 - ((double)(int)texture->TopOffset / dVar17) /
                        ((double)texture->Height / dVar17)) * (double)in_stack_00000038;
    }
  }
  local_40 = (double)xOffset + local_40;
  local_60 = (double)yOffset + local_60;
  local_58 = Alpha;
  if (!fullScreenOffsets) {
    tmp = 0.0;
    local_40 = local_40 + (double)*(int *)&(this->super_DBaseStatusBar).super_DObject.field_0x24;
    bVar4 = (this->super_DBaseStatusBar).Scaled;
    pSVar5 = this->script;
    iVar12 = 200;
    if (bVar4 == true) {
      iVar12 = pSVar5->resH;
    }
    local_60 = local_60 + (double)(((this->super_DBaseStatusBar).ST_Y - iVar12) + pSVar5->height);
    if (in_stack_00000030 < 0) {
      rx = (double)texture->Width / (texture->Scale).X;
    }
    else {
      rx = (double)in_stack_00000030;
    }
    if (in_stack_00000038 < 0) {
      ry = (double)texture->Height / (texture->Scale).Y;
    }
    else {
      ry = (double)in_stack_00000038;
    }
    dVar17 = *in_stack_00000040;
    dcy = 0.0;
    yScale = 0.0;
    if ((dVar17 != 0.0) || (NAN(dVar17))) {
      yScale = (local_40 + dVar17) - (double)(int)texture->LeftOffset / (texture->Scale).X;
    }
    dVar15 = in_stack_00000040[1];
    if ((dVar15 != 0.0) || (NAN(dVar15))) {
      dcy = (local_60 + dVar15) - (double)(int)texture->TopOffset / (texture->Scale).Y;
    }
    dVar16 = in_stack_00000040[2];
    dcb = 2147483647.0;
    dcr = 2147483647.0;
    if ((dVar16 != 0.0) || (NAN(dVar16))) {
      dcr = ((local_40 + rx) - dVar16) - (double)(int)texture->LeftOffset / (texture->Scale).X;
    }
    dVar16 = in_stack_00000040[3];
    if ((dVar16 != 0.0) || (NAN(dVar16))) {
      dcb = ((ry + local_60) - dVar16) - (double)(int)texture->TopOffset / (texture->Scale).Y;
    }
    if (bVar4 == false) {
      dVar17 = (double)(200 - pSVar5->resH);
      local_60 = local_60 + dVar17;
      dcy = dcy + dVar17;
      dcb = dcb + dVar17;
    }
    else {
      if ((((dVar17 != 0.0) || (NAN(dVar17))) || (dVar15 != 0.0)) || (NAN(dVar15))) {
        DCanvas::VirtualToRealCoords
                  ((DCanvas *)screen,&yScale,&dcy,&tmp,&tmp,(double)pSVar5->resW,
                   (double)pSVar5->resH,true,true);
        if ((*in_stack_00000040 == 0.0) && (!NAN(*in_stack_00000040))) {
          yScale = 0.0;
        }
        if ((in_stack_00000040[1] == 0.0) && (!NAN(in_stack_00000040[1]))) {
          dcy = 0.0;
        }
      }
      if (((in_stack_00000040[2] != 0.0) || (NAN(in_stack_00000040[2]))) ||
         ((in_stack_00000040[3] == 0.0 & (w._0_1_ ^ 1)) == 0)) {
        DCanvas::VirtualToRealCoords
                  ((DCanvas *)screen,&dcr,&dcb,&tmp,&tmp,(double)this->script->resW,
                   (double)this->script->resH,true,true);
      }
      DCanvas::VirtualToRealCoords
                ((DCanvas *)screen,&local_40,&local_60,&rx,&ry,(double)this->script->resW,
                 (double)this->script->resH,true,true);
    }
    dVar17 = local_40;
    this_00 = screen;
    if (w._0_1_ == 0) {
      uVar10 = (uint)yScale;
      uVar6 = (ulong)(uint)(int)dcy;
      dVar15 = 2147483647.0;
      if (dcr <= 2147483647.0) {
        dVar15 = dcr;
      }
      uVar8 = (ulong)(uint)(int)dVar15;
      dVar15 = 2147483647.0;
      if (dcb <= 2147483647.0) {
        dVar15 = dcb;
      }
      uVar13 = (ulong)(uint)(int)dVar15;
      uVar14 = 0;
      dVar15 = rx;
      dVar16 = ry;
      if (h._0_1_ != '\0') {
        if (translate) {
          local_78 = rx;
          local_80 = local_60;
          local_88 = ry;
          pFVar9 = GetTranslation(this);
          dVar18 = local_80;
          dVar15 = local_78;
          dVar16 = local_88;
        }
        else {
          pFVar9 = (FRemapTable *)0x0;
          dVar18 = local_60;
        }
        if (dim) {
          uVar14 = 0xaa000000;
        }
        goto LAB_004b4b8b;
      }
      if (translate) {
        local_78 = rx;
        local_80 = local_60;
        local_88 = ry;
        pFVar9 = GetTranslation(this);
        dVar18 = local_80;
        dVar15 = local_78;
        dVar16 = local_88;
      }
      else {
        pFVar9 = (FRemapTable *)0x0;
        dVar18 = local_60;
      }
      if (dim) {
        uVar14 = 0xaa000000;
      }
      goto LAB_004b4c81;
    }
    if (local_40 <= yScale) {
      dVar17 = yScale;
    }
    uVar10 = (uint)dVar17;
    dVar15 = local_60;
    if (local_60 <= dcy) {
      dVar15 = dcy;
    }
    uVar6 = (ulong)(uint)(int)dVar15;
    dVar18 = dcr;
    if (dVar17 + rx <= dcr) {
      dVar18 = dVar17 + rx;
    }
    dVar17 = dcb;
    if (dVar15 + ry <= dcb) {
      dVar17 = dVar15 + ry;
    }
    pp_Var7 = (screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject;
    goto LAB_004b4970;
  }
  if (hud_scale.Value) {
    uVar1 = this->script->cleanX;
    uVar3 = this->script->cleanY;
    tmp = (double)(int)uVar1;
    yScale = (double)(int)uVar3;
  }
  else {
    tmp = 1.0;
    yScale = 1.0;
  }
  adjustRelCenter((bool)(x._0_1_ & 1),(bool)(y._0_1_ & 1),&local_40,&local_60,&rx,&ry,&tmp,&yScale);
  this_00 = screen;
  if (in_stack_00000030 < 0) {
    dVar15 = (double)texture->Width / (texture->Scale).X;
  }
  else {
    dVar15 = (double)in_stack_00000030;
  }
  if (in_stack_00000038 < 0) {
    dVar16 = (double)texture->Height / (texture->Scale).Y;
  }
  else {
    dVar16 = (double)in_stack_00000038;
  }
  if (((vid_fps.Value == true) && (rx < 0.0)) && (0.0 <= ry)) {
    ry = ry + 10.0;
  }
  if (hud_scale.Value == true) {
    rx = rx * tmp;
    ry = ry * yScale;
    dVar15 = dVar15 * tmp;
    dVar16 = dVar16 * yScale;
  }
  if ((int)x >> 1 < 0 && ((uint)x & 1) == 0) {
    rx = rx + (double)(screen->super_DSimpleCanvas).super_DCanvas.Width;
  }
  if ((int)y >> 1 < 0 && ((uint)y & 1) == 0) {
    ry = ry + (double)(screen->super_DSimpleCanvas).super_DCanvas.Height;
  }
  dVar17 = *in_stack_00000040;
  dVar20 = 0.0;
  if (((dVar17 != 0.0) || (NAN(dVar17))) ||
     ((in_stack_00000040[1] != 0.0 || (NAN(in_stack_00000040[1]))))) {
LAB_004b4844:
    if ((dVar17 != 0.0) || (NAN(dVar17))) {
      dVar20 = (dVar17 - (double)(int)texture->LeftOffset / (texture->Scale).X) * tmp + rx;
    }
    dVar17 = in_stack_00000040[1];
    dVar19 = 0.0;
    if ((dVar17 != 0.0) || (NAN(dVar17))) {
      dVar19 = (dVar17 - (double)(int)texture->TopOffset / (texture->Scale).Y) * yScale + ry;
    }
    dVar2 = in_stack_00000040[2];
    dVar17 = 2147483647.0;
    dVar18 = 2147483647.0;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      dVar18 = (rx + dVar15) - (dVar2 + (double)(int)texture->LeftOffset / (texture->Scale).X) * tmp
      ;
    }
    dVar2 = in_stack_00000040[3];
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      dVar17 = (ry + dVar16) -
               (dVar2 + (double)(int)texture->TopOffset / (texture->Scale).Y) * yScale;
    }
  }
  else {
    dVar19 = 0.0;
    if ((((in_stack_00000040[2] != 0.0) || (NAN(in_stack_00000040[2]))) ||
        (in_stack_00000040[3] != 0.0)) || (NAN(in_stack_00000040[3]))) goto LAB_004b4844;
    dVar17 = 2147483647.0;
    dVar18 = dVar17;
  }
  uVar10 = (uint)dVar20;
  uVar6 = (ulong)(uint)(int)dVar19;
  if (w._0_1_ == 0) {
    uVar8 = (ulong)(uint)(int)dVar18;
    uVar13 = (ulong)(uint)(int)dVar17;
    uVar14 = 0;
    dVar17 = rx;
    if (h._0_1_ != '\0') {
      if (translate) {
        local_88 = rx;
        local_80 = ry;
        local_78 = dVar16;
        pFVar9 = GetTranslation(this);
        dVar17 = local_88;
        dVar18 = local_80;
        dVar16 = local_78;
      }
      else {
        pFVar9 = (FRemapTable *)0x0;
        dVar18 = ry;
      }
      if (dim) {
        uVar14 = 0xaa000000;
      }
LAB_004b4b8b:
      DCanvas::DrawTexture
                ((DCanvas *)this_00,texture,dVar17,dVar18,0x400013af,dVar15,dVar16,local_58,
                 0x400013b0,0x400013a3,(ulong)uVar10,0x400013a1,uVar6,0x400013a4,uVar8,0x400013a2,
                 uVar13,0x4000138e,pFVar9,0x400013aa,uVar14,0x4000139e,(ulong)((uVar11 & 0x44) == 0)
                 ,0x4000138c,0x4000138f,1,0x4000138d,0,0);
      return;
    }
    if (translate) {
      local_88 = rx;
      local_80 = ry;
      local_78 = dVar16;
      pFVar9 = GetTranslation(this);
      dVar17 = local_88;
      dVar18 = local_80;
      dVar16 = local_78;
    }
    else {
      pFVar9 = (FRemapTable *)0x0;
      dVar18 = ry;
    }
    if (dim) {
      uVar14 = 0xaa000000;
    }
LAB_004b4c81:
    DCanvas::DrawTexture
              ((DCanvas *)this_00,texture,dVar17,dVar18,0x400013af,dVar15,dVar16,local_58,0x400013b0
               ,0x400013a3,(ulong)uVar10,0x400013a1,uVar6,0x400013a4,uVar8,0x400013a2,uVar13,
               0x4000138e,pFVar9,0x400013aa,uVar14,0x4000139e,(ulong)((uVar11 & 0x44) == 0),
               0x4000138c,0);
    return;
  }
  if (dVar20 + dVar15 <= dVar18) {
    dVar18 = dVar20 + dVar15;
  }
  if (dVar19 + dVar16 <= dVar17) {
    dVar17 = dVar19 + dVar16;
  }
  pp_Var7 = (screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject;
LAB_004b4970:
  (*pp_Var7[0x13])(screen,(ulong)uVar10,uVar6,(ulong)(uint)(int)dVar18,(ulong)(uint)(int)dVar17,
                   (ulong)GPalette.BlackIndex,0);
  return;
}

Assistant:

void DrawGraphic(FTexture* texture, SBarInfoCoordinate x, SBarInfoCoordinate y, int xOffset, int yOffset, double Alpha, bool fullScreenOffsets, bool translate=false, bool dim=false, int offsetflags=0, bool alphaMap=false, int forceWidth=-1, int forceHeight=-1, const double *clip = nulclip, bool clearDontDraw=false) const
	{
		if (texture == NULL)
			return;

		double dx = *x;
		double dy = *y;

		if((offsetflags & SBarInfoCommand::CENTER) == SBarInfoCommand::CENTER)
		{
			if (forceWidth < 0)	dx -= (texture->GetScaledWidthDouble()/2.0)-texture->GetScaledLeftOffsetDouble();
			else	dx -= forceWidth*(0.5-(texture->GetScaledLeftOffsetDouble()/texture->GetScaledWidthDouble()));
			//Unoptimalized formula is dx -= forceWidth/2.0-(texture->GetScaledLeftOffsetDouble()*forceWidth/texture->GetScaledWidthDouble());
			
			if (forceHeight < 0)	dy -= (texture->GetScaledHeightDouble()/2.0)-texture->GetScaledTopOffsetDouble();
			else	dy -= forceHeight*(0.5-(texture->GetScaledTopOffsetDouble()/texture->GetScaledHeightDouble()));
		}

		dx += xOffset;
		dy += yOffset;
		double w, h;
		if(!fullScreenOffsets)
		{
			double tmp = 0;
			dx += ST_X;
			dy += ST_Y - (Scaled ? script->resH : 200) + script->height;
			w = forceWidth < 0 ? texture->GetScaledWidthDouble() : forceWidth;
			h = forceHeight < 0 ? texture->GetScaledHeightDouble() : forceHeight;
			double dcx = clip[0] == 0 ? 0 : dx + clip[0] - texture->GetScaledLeftOffsetDouble();
			double dcy = clip[1] == 0 ? 0 : dy + clip[1] - texture->GetScaledTopOffsetDouble();
			double dcr = clip[2] == 0 ? INT_MAX : dx + w - clip[2] - texture->GetScaledLeftOffsetDouble();
			double dcb = clip[3] == 0 ? INT_MAX : dy + h - clip[3] - texture->GetScaledTopOffsetDouble();

			if(Scaled)
			{
				if(clip[0] != 0 || clip[1] != 0)
				{
					screen->VirtualToRealCoords(dcx, dcy, tmp, tmp, script->resW, script->resH, true);
					if (clip[0] == 0) dcx = 0;
					if (clip[1] == 0) dcy = 0;
				}
				if(clip[2] != 0 || clip[3] != 0 || clearDontDraw)
					screen->VirtualToRealCoords(dcr, dcb, tmp, tmp, script->resW, script->resH, true);
				screen->VirtualToRealCoords(dx, dy, w, h, script->resW, script->resH, true);
			}
			else
			{
				dy += 200 - script->resH;
				dcy += 200 - script->resH;
				dcb += 200 - script->resH;
			}

			if(clearDontDraw)
				screen->Clear(static_cast<int>(MAX<double>(dx, dcx)), static_cast<int>(MAX<double>(dy, dcy)), static_cast<int>(MIN<double>(dcr,w+MAX<double>(dx, dcx))), static_cast<int>(MIN<double>(dcb,MAX<double>(dy, dcy)+h)), GPalette.BlackIndex, 0);
			else
			{
				if(alphaMap)
				{
					screen->DrawTexture(texture, dx, dy,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(dcx),
						DTA_ClipTop, static_cast<int>(dcy),
						DTA_ClipRight, static_cast<int>(MIN<double>(INT_MAX, dcr)),
						DTA_ClipBottom, static_cast<int>(MIN<double>(INT_MAX, dcb)),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						DTA_AlphaChannel, alphaMap,
						DTA_FillColor, 0,
						TAG_DONE);
				}
				else
				{
					screen->DrawTexture(texture, dx, dy,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(dcx),
						DTA_ClipTop, static_cast<int>(dcy),
						DTA_ClipRight, static_cast<int>(MIN<double>(INT_MAX, dcr)),
						DTA_ClipBottom, static_cast<int>(MIN<double>(INT_MAX, dcb)),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						TAG_DONE);
				}
			}
		}
		else
		{
			double rx, ry, rcx=0, rcy=0, rcr=INT_MAX, rcb=INT_MAX;

			double xScale = !hud_scale ? 1 : script->cleanX;
			double yScale = !hud_scale ? 1 : script->cleanY;

			adjustRelCenter(x.RelCenter(), y.RelCenter(), dx, dy, rx, ry, xScale, yScale);

			// We can't use DTA_HUDRules since it forces a width and height.
			// Translation: No high res.
			bool xright = *x < 0 && !x.RelCenter();
			bool ybot = *y < 0 && !y.RelCenter();

			w = (forceWidth < 0 ? texture->GetScaledWidthDouble() : forceWidth);
			h = (forceHeight < 0 ? texture->GetScaledHeightDouble() : forceHeight);
			if(vid_fps && rx < 0 && ry >= 0)
				ry += 10;
			if(hud_scale)
			{
				rx *= xScale;
				ry *= yScale;
				w *= xScale;
				h *= yScale;
			}
			if(xright)
				rx = SCREENWIDTH + rx;
			if(ybot)
				ry = SCREENHEIGHT + ry;

			// Check for clipping
			if(clip[0] != 0 || clip[1] != 0 || clip[2] != 0 || clip[3] != 0)
			{
				rcx = clip[0] == 0 ? 0 : rx+((clip[0] - texture->GetScaledLeftOffsetDouble())*xScale);
				rcy = clip[1] == 0 ? 0 : ry+((clip[1] - texture->GetScaledTopOffsetDouble())*yScale);
				rcr = clip[2] == 0 ? INT_MAX : rx+w-((clip[2] + texture->GetScaledLeftOffsetDouble())*xScale);
				rcb = clip[3] == 0 ? INT_MAX : ry+h-((clip[3] + texture->GetScaledTopOffsetDouble())*yScale);
			}

			if(clearDontDraw)
				screen->Clear(static_cast<int>(rcx), static_cast<int>(rcy), static_cast<int>(MIN<double>(rcr, rcx+w)), static_cast<int>(MIN<double>(rcb, rcy+h)), GPalette.BlackIndex, 0);
			else
			{
				if(alphaMap)
				{
					screen->DrawTexture(texture, rx, ry,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(rcx),
						DTA_ClipTop, static_cast<int>(rcy),
						DTA_ClipRight, static_cast<int>(rcr),
						DTA_ClipBottom, static_cast<int>(rcb),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						DTA_AlphaChannel, alphaMap,
						DTA_FillColor, 0,
						TAG_DONE);
				}
				else
				{
					screen->DrawTexture(texture, rx, ry,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(rcx),
						DTA_ClipTop, static_cast<int>(rcy),
						DTA_ClipRight, static_cast<int>(rcr),
						DTA_ClipBottom, static_cast<int>(rcb),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						TAG_DONE);
				}
			}
		}
	}